

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtoolbox.cpp
# Opt level: O0

void QToolBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  QToolBox *this;
  QMetaType QVar4;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QToolBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QToolBox *_t;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  int index;
  QToolBox *in_stack_ffffffffffffffa0;
  QToolBoxPrivate *in_stack_ffffffffffffffb8;
  QMetaType local_18;
  QMetaType local_10;
  long local_8;
  
  index = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    this = (QToolBox *)(ulong)in_EDX;
    switch(this) {
    case (QToolBox *)0x0:
      currentChanged((QToolBox *)0x70464b,in_stack_ffffffffffffff8c);
      break;
    case (QToolBox *)0x1:
      setCurrentIndex(in_stack_ffffffffffffffa0,0);
      break;
    case (QToolBox *)0x2:
      setCurrentWidget(this,(QWidget *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)
                      );
      break;
    case (QToolBox *)0x3:
      d_func((QToolBox *)0x704686);
      QToolBoxPrivate::_q_buttonClicked(in_stack_ffffffffffffffb8);
      break;
    case (QToolBox *)0x4:
      d_func((QToolBox *)0x70469a);
      QToolBoxPrivate::_q_widgetDestroyed(in_RDI,(QObject *)CONCAT44(in_ESI,in_EDX));
    }
    index = (int)((ulong)this >> 0x20);
  }
  if (in_ESI == 7) {
    if (in_EDX == 2) {
      if (**(int **)(in_RCX + 8) == 0) {
        QVar4 = QMetaType::fromType<QWidget*>();
        **(undefined8 **)in_RCX = QVar4.d_ptr;
      }
      else {
        memset(&local_18,0,8);
        QMetaType::QMetaType(&local_18);
        **(undefined8 **)in_RCX = local_18.d_ptr;
      }
    }
    else {
      memset(&local_10,0,8);
      QMetaType::QMetaType(&local_10);
      **(undefined8 **)in_RCX = local_10.d_ptr;
    }
  }
  if ((in_ESI != 5) ||
     (bVar2 = QtMocHelpers::indexOfMethod<void(QToolBox::*)(int)>
                        (in_RCX,(void **)currentChanged,0,0), !bVar2)) {
    if (in_ESI == 1) {
      piVar1 = *(int **)in_RCX;
      if (in_EDX == 0) {
        iVar3 = currentIndex(in_stack_ffffffffffffffa0);
        *piVar1 = iVar3;
      }
      else if (in_EDX == 1) {
        iVar3 = count((QToolBox *)CONCAT44(1,in_stack_ffffffffffffff90));
        *piVar1 = iVar3;
      }
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setCurrentIndex(*(QToolBox **)in_RCX,index);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QToolBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QToolBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCurrentWidget((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->d_func()->_q_buttonClicked(); break;
        case 4: _t->d_func()->_q_widgetDestroyed((*reinterpret_cast< std::add_pointer_t<QObject*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QToolBox::*)(int )>(_a, &QToolBox::currentChanged, 0))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->count(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}